

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::DCT_Upsample::Matrix44::sub_and_store(jpgd_block_t *pDst,Matrix44 *a,Matrix44 *b)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 2) {
    *(short *)((long)pDst + lVar1) = (short)a->v[0][lVar1 * 2] - (short)b->v[0][lVar1 * 2];
    *(short *)((long)pDst + lVar1 + 0x10) =
         (short)a->v[0][lVar1 * 2 + 1] - (short)b->v[0][lVar1 * 2 + 1];
    *(short *)((long)pDst + lVar1 + 0x20) =
         (short)a->v[0][lVar1 * 2 + 2] - (short)b->v[0][lVar1 * 2 + 2];
    *(short *)((long)pDst + lVar1 + 0x30) =
         (short)a->v[0][lVar1 * 2 + 3] - (short)b->v[0][lVar1 * 2 + 3];
  }
  return;
}

Assistant:

static inline void sub_and_store(jpgd_block_t* pDst, const Matrix44& a, const Matrix44& b)
    {
      for (int r = 0; r < 4; r++)
      {
        pDst[0*8 + r] = static_cast<jpgd_block_t>(a.at(r, 0) - b.at(r, 0));
        pDst[1*8 + r] = static_cast<jpgd_block_t>(a.at(r, 1) - b.at(r, 1));
        pDst[2*8 + r] = static_cast<jpgd_block_t>(a.at(r, 2) - b.at(r, 2));
        pDst[3*8 + r] = static_cast<jpgd_block_t>(a.at(r, 3) - b.at(r, 3));
      }
    }